

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O3

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
          AsyncResult<int> *param,AsyncResult<int> *param_3,AsyncResult<int> *param_4,int *param_5)

{
  _func_void *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *local_38;
  
  local_70 = 0;
  local_38 = fn;
  local_78 = (_func_void *)operator_new(0x28);
  *(_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int ***)local_78 = &local_38;
  *(AsyncResult<int> **)(local_78 + 8) = param;
  *(AsyncResult<int> **)(local_78 + 0x10) = param_3;
  *(AsyncResult<int> **)(local_78 + 0x18) = param_4;
  *(int **)(local_78 + 0x20) = param_5;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/SyncExecutor.h:57:20)>
             ::_M_invoke;
  local_58._8_8_ = local_70;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/SyncExecutor.h:57:20)>
             ::_M_manager;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_58._M_unused._0_8_ = (undefined8)local_78;
  operator()(this,(Function *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
  }
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }